

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

SQInteger __thiscall SQCompiler::Factor(SQCompiler *this)

{
  long lVar1;
  bool bVar2;
  SQInteger SVar3;
  SQCompiler *in_RDI;
  SQObject SVar4;
  SQInteger array;
  SQInteger val;
  SQInteger key;
  SQInteger apos;
  SQObjectType ctype;
  SQObject constid;
  SQObjectPtr constval;
  SQInteger pos;
  SQObject constant;
  SQObject id;
  SQCompiler *in_stack_fffffffffffffe00;
  SQCompiler *pSVar5;
  SQCompiler *in_stack_fffffffffffffe08;
  SQCompiler *in_stack_fffffffffffffe10;
  SQFuncState *in_stack_fffffffffffffe18;
  SQFuncState *pSVar6;
  SQCompiler *in_stack_fffffffffffffe20;
  SQTable *in_stack_fffffffffffffe28;
  SQOpcode SVar7;
  SQCompiler *in_stack_fffffffffffffe30;
  SQObject *in_stack_fffffffffffffe38;
  SQObject *in_stack_fffffffffffffe40;
  SQFuncState *in_stack_fffffffffffffe48;
  SQCompiler *in_stack_fffffffffffffe50;
  SQObject *in_stack_fffffffffffffe58;
  SQFuncState *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  SQCompiler *in_stack_fffffffffffffea8;
  SQCompiler *in_stack_fffffffffffffec0;
  SQFuncState *in_stack_fffffffffffffec8;
  SQObjectValue in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  SQCompiler *in_stack_ffffffffffffff40;
  SQObject local_98;
  SQObjectPtr local_88;
  SQInteger local_78;
  SQObjectType local_70;
  undefined4 uStack_6c;
  SQObjectValue local_68;
  SQObjectType local_60;
  undefined4 uStack_5c;
  SQObjectValue local_58;
  SQObjectType local_50;
  undefined4 uStack_4c;
  SQObjectValue local_48;
  int local_40;
  undefined8 local_30;
  SQObjectValue local_28;
  SQObjectType local_20;
  SQObjectValue local_18;
  
  lVar1 = in_RDI->_token;
  if (lVar1 == 0x21) {
    Lex(in_stack_fffffffffffffe00);
    UnaryOP(in_stack_fffffffffffffe20,(SQOpcode)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  }
  else if (lVar1 == 0x28) {
    Lex(in_stack_fffffffffffffe00);
    CommaExpr(in_stack_fffffffffffffe00);
    Expect(in_stack_fffffffffffffea8,CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  }
  else if (lVar1 == 0x2d) {
    Lex(in_stack_fffffffffffffe00);
    if (in_RDI->_token == 0x104) {
      EmitLoadConstInt(in_stack_fffffffffffffe20,(SQInteger)in_stack_fffffffffffffe18,0x104);
      Lex(in_stack_fffffffffffffe00);
    }
    else if (in_RDI->_token == 0x105) {
      EmitLoadConstFloat((SQCompiler *)0x105,(SQFloat)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                         (SQInteger)in_stack_fffffffffffffe00);
      Lex(in_stack_fffffffffffffe00);
    }
    else {
      UnaryOP(in_stack_fffffffffffffe20,(SQOpcode)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    }
  }
  else {
    bVar2 = SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0);
    if (lVar1 == 0x40) {
      FunctionExp(in_stack_fffffffffffffe50,(SQInteger)in_stack_fffffffffffffe48,bVar2);
    }
    else if (lVar1 == 0x5b) {
      pSVar6 = in_RDI->_fs;
      SQFuncState::PushTarget
                ((SQFuncState *)in_stack_fffffffffffffe08,(SQInteger)in_stack_fffffffffffffe00);
      SQFuncState::AddInstruction
                ((SQFuncState *)in_stack_fffffffffffffe30,
                 (SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20),(SQInteger)pSVar6,
                 (SQInteger)in_stack_fffffffffffffe18,(SQInteger)in_stack_fffffffffffffe10,
                 (SQInteger)in_stack_fffffffffffffe08);
      SQFuncState::GetCurrentPos((SQFuncState *)0x12555e);
      Lex(in_stack_fffffffffffffe00);
      while (in_RDI->_token != 0x5d) {
        Expression(in_stack_fffffffffffffec0);
        if (in_RDI->_token == 0x2c) {
          Lex(in_stack_fffffffffffffe00);
        }
        SQFuncState::PopTarget((SQFuncState *)in_stack_fffffffffffffe10);
        SQFuncState::TopTarget((SQFuncState *)0x1255e6);
        SQFuncState::AddInstruction
                  ((SQFuncState *)in_stack_fffffffffffffe30,
                   (SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20),(SQInteger)pSVar6,
                   (SQInteger)in_stack_fffffffffffffe18,(SQInteger)in_stack_fffffffffffffe10,
                   (SQInteger)in_stack_fffffffffffffe08);
      }
      SQFuncState::SetIntructionParam
                ((SQFuncState *)in_stack_fffffffffffffe30,(SQInteger)in_stack_fffffffffffffe28,
                 (SQInteger)pSVar6,(SQInteger)in_stack_fffffffffffffe18);
      Lex(in_stack_fffffffffffffe00);
    }
    else if (lVar1 == 0x7b) {
      pSVar6 = in_RDI->_fs;
      SQFuncState::PushTarget
                ((SQFuncState *)in_stack_fffffffffffffe08,(SQInteger)in_stack_fffffffffffffe00);
      SQFuncState::AddInstruction
                ((SQFuncState *)in_stack_fffffffffffffe30,
                 (SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                 (SQInteger)in_stack_fffffffffffffe20,(SQInteger)pSVar6,
                 (SQInteger)in_stack_fffffffffffffe10,(SQInteger)in_stack_fffffffffffffe08);
      Lex(in_stack_fffffffffffffe00);
      ParseTableOrClass(in_stack_ffffffffffffff40,
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        in_stack_ffffffffffffff30.nInteger);
    }
    else if (lVar1 == 0x7e) {
      Lex(in_stack_fffffffffffffe00);
      if (in_RDI->_token == 0x104) {
        EmitLoadConstInt(in_stack_fffffffffffffe20,(SQInteger)in_stack_fffffffffffffe18,
                         (SQInteger)in_stack_fffffffffffffe10);
        Lex(in_stack_fffffffffffffe00);
      }
      else {
        UnaryOP(in_stack_fffffffffffffe20,(SQOpcode)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      }
    }
    else {
      if (lVar1 == 0x102) goto LAB_00124cea;
      if (lVar1 == 0x103) {
        SQFuncState::PushTarget
                  ((SQFuncState *)in_stack_fffffffffffffe08,(SQInteger)in_stack_fffffffffffffe00);
        SVar7 = (SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20);
        sqvector<char>::size(&(in_RDI->_lex)._longstr);
        SVar4 = SQFuncState::CreateString
                          (in_stack_fffffffffffffe48,(SQChar *)in_stack_fffffffffffffe40,
                           (SQInteger)in_stack_fffffffffffffe38);
        local_18 = SVar4._unVal;
        local_20 = SVar4._type;
        SQFuncState::GetConstant(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        SQFuncState::AddInstruction
                  ((SQFuncState *)in_stack_fffffffffffffe30,SVar7,
                   (SQInteger)in_stack_fffffffffffffe20,(SQInteger)in_stack_fffffffffffffe18,
                   (SQInteger)in_stack_fffffffffffffe10,(SQInteger)in_stack_fffffffffffffe08);
        Lex(in_stack_fffffffffffffe00);
      }
      else if (lVar1 == 0x104) {
        EmitLoadConstInt(in_stack_fffffffffffffe20,(SQInteger)in_stack_fffffffffffffe18,
                         (SQInteger)in_stack_fffffffffffffe10);
        Lex(in_stack_fffffffffffffe00);
      }
      else if (lVar1 == 0x105) {
        EmitLoadConstFloat(in_stack_fffffffffffffe10,
                           (SQFloat)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                           (SQInteger)in_stack_fffffffffffffe00);
        Lex(in_stack_fffffffffffffe00);
      }
      else {
        if (lVar1 == 0x106) {
          Lex(in_stack_fffffffffffffe00);
          SVar7 = (SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20);
          SQFuncState::PushTarget
                    ((SQFuncState *)in_stack_fffffffffffffe08,(SQInteger)in_stack_fffffffffffffe00);
          SQFuncState::AddInstruction
                    ((SQFuncState *)in_stack_fffffffffffffe30,SVar7,
                     (SQInteger)in_stack_fffffffffffffe20,(SQInteger)in_stack_fffffffffffffe18,
                     (SQInteger)in_stack_fffffffffffffe10,(SQInteger)in_stack_fffffffffffffe08);
          (in_RDI->_es).etype = 3;
          SVar3 = SQFuncState::TopTarget((SQFuncState *)0x124cc4);
          (in_RDI->_es).epos = SVar3;
          return (in_RDI->_es).epos;
        }
        if (lVar1 == 0x107) {
          DeleteExpr(in_stack_fffffffffffffe10);
        }
        else if (lVar1 == 0x116) {
          pSVar6 = in_RDI->_fs;
          SQFuncState::PushTarget
                    ((SQFuncState *)in_stack_fffffffffffffe08,(SQInteger)in_stack_fffffffffffffe00);
          SQFuncState::AddInstruction
                    (pSVar6,(SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                     (SQInteger)in_stack_fffffffffffffe20,(SQInteger)in_stack_fffffffffffffe18,
                     (SQInteger)in_stack_fffffffffffffe10,(SQInteger)in_stack_fffffffffffffe08);
          Lex(in_stack_fffffffffffffe00);
        }
        else if (lVar1 == 0x11c) {
          Lex(in_stack_fffffffffffffe00);
          UnaryOP(in_stack_fffffffffffffe20,(SQOpcode)((ulong)in_stack_fffffffffffffe18 >> 0x20));
        }
        else if (lVar1 == 0x11d) {
          FunctionExp(in_stack_fffffffffffffe50,(SQInteger)in_stack_fffffffffffffe48,bVar2);
        }
        else if (lVar1 == 0x11f) {
          Lex(in_stack_fffffffffffffe00);
          UnaryOP(in_stack_fffffffffffffe20,(SQOpcode)((ulong)in_stack_fffffffffffffe18 >> 0x20));
        }
        else if (lVar1 == 0x12a) {
          Lex(in_stack_fffffffffffffe00);
          UnaryOP(in_stack_fffffffffffffe20,(SQOpcode)((ulong)in_stack_fffffffffffffe18 >> 0x20));
        }
        else {
          if (lVar1 == 299) {
            SQFuncState::PushTarget
                      ((SQFuncState *)in_stack_fffffffffffffe08,(SQInteger)in_stack_fffffffffffffe00
                      );
            SQFuncState::AddInstruction
                      ((SQFuncState *)in_stack_fffffffffffffe30,
                       (SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                       (SQInteger)in_stack_fffffffffffffe20,(SQInteger)in_stack_fffffffffffffe18,
                       (SQInteger)in_stack_fffffffffffffe10,(SQInteger)in_stack_fffffffffffffe08);
            (in_RDI->_es).etype = 2;
            in_RDI->_token = 0x2e;
            (in_RDI->_es).epos = -1;
            return (in_RDI->_es).epos;
          }
          if (lVar1 == 0x12e) {
LAB_00124cea:
            pSVar5 = (SQCompiler *)in_RDI->_token;
            if (pSVar5 == (SQCompiler *)0x102) {
              SVar4 = SQFuncState::CreateString
                                (in_stack_fffffffffffffe48,(SQChar *)in_stack_fffffffffffffe40,
                                 (SQInteger)in_stack_fffffffffffffe38);
              local_48 = SVar4._unVal;
              local_50 = SVar4._type;
              local_30 = CONCAT44(uStack_4c,local_50);
              local_28.nInteger = local_48.nInteger;
            }
            else if (pSVar5 == (SQCompiler *)0x12e) {
              SVar4 = SQFuncState::CreateString
                                (in_stack_fffffffffffffe48,(SQChar *)in_stack_fffffffffffffe40,
                                 (SQInteger)in_stack_fffffffffffffe38);
              local_58 = SVar4._unVal;
              local_60 = SVar4._type;
              local_30 = CONCAT44(uStack_5c,local_60);
              local_28.nInteger = local_58.nInteger;
            }
            else if (pSVar5 == (SQCompiler *)0x136) {
              SVar4 = SQFuncState::CreateString
                                (in_stack_fffffffffffffe48,(SQChar *)in_stack_fffffffffffffe40,
                                 (SQInteger)in_stack_fffffffffffffe38);
              local_68 = SVar4._unVal;
              local_70 = SVar4._type;
              local_30 = CONCAT44(uStack_6c,local_70);
              local_28.nInteger = local_68.nInteger;
            }
            local_78 = 0xffffffffffffffff;
            Lex(in_stack_fffffffffffffe00);
            local_78 = SQFuncState::GetLocalVariable
                                 (in_stack_fffffffffffffe18,(SQObject *)in_stack_fffffffffffffe10);
            if (local_78 == -1) {
              local_78 = SQFuncState::GetOuterVariable
                                   (in_stack_fffffffffffffec8,(SQObject *)in_stack_fffffffffffffec0)
              ;
              if (local_78 == -1) {
                bVar2 = SQFuncState::IsConstant
                                  (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                   in_stack_fffffffffffffe38);
                if (bVar2) {
                  ::SQObjectPtr::SQObjectPtr(&local_88);
                  if (local_40 == 0xa000020) {
                    SVar4 = Expect(pSVar5,CONCAT44(in_stack_fffffffffffffea4,
                                                   in_stack_fffffffffffffea0));
                    SVar4 = Expect(pSVar5,CONCAT44(SVar4._type,in_stack_fffffffffffffea0));
                    local_98._unVal = SVar4._unVal;
                    local_98._4_4_ = in_stack_ffffffffffffff3c;
                    local_98._type = SVar4._type;
                    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff28,&local_98);
                    bVar2 = SQTable::Get(in_stack_fffffffffffffe28,
                                         (SQObjectPtr *)in_stack_fffffffffffffe20,
                                         (SQObjectPtr *)in_stack_fffffffffffffe18);
                    SVar7 = (SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20);
                    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffe00);
                    if (((bVar2 ^ 0xffU) & 1) != 0) {
                      ::SQObjectPtr::Null((SQObjectPtr *)in_stack_fffffffffffffe00);
                      Error(in_RDI,"invalid constant [%s.%s]",&(local_28.pTable)->_firstfree,
                            &(local_98._unVal.pTable)->_firstfree);
                    }
                  }
                  else {
                    ::SQObjectPtr::operator=
                              ((SQObjectPtr *)in_stack_fffffffffffffe10,
                               (SQObject *)in_stack_fffffffffffffe08);
                    SVar7 = (SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20);
                  }
                  SVar3 = SQFuncState::PushTarget
                                    ((SQFuncState *)in_stack_fffffffffffffe08,
                                     (SQInteger)in_stack_fffffffffffffe00);
                  (in_RDI->_es).epos = SVar3;
                  if (local_88.super_SQObject._type == OT_BOOL) {
                    SQFuncState::AddInstruction
                              ((SQFuncState *)in_stack_fffffffffffffe30,SVar7,
                               (SQInteger)in_stack_fffffffffffffe20,
                               (SQInteger)in_stack_fffffffffffffe18,
                               (SQInteger)in_stack_fffffffffffffe10,
                               (SQInteger)in_stack_fffffffffffffe08);
                  }
                  else if (local_88.super_SQObject._type == OT_INTEGER) {
                    EmitLoadConstInt(in_stack_fffffffffffffe20,(SQInteger)in_stack_fffffffffffffe18,
                                     (SQInteger)in_stack_fffffffffffffe10);
                  }
                  else if (local_88.super_SQObject._type == OT_FLOAT) {
                    EmitLoadConstFloat(in_stack_fffffffffffffe10,
                                       (SQFloat)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                                       (SQInteger)in_stack_fffffffffffffe00);
                  }
                  else {
                    SQFuncState::GetConstant
                              (in_stack_fffffffffffffe60,(SQObject *)(in_RDI->_es).epos);
                    SQFuncState::AddInstruction
                              ((SQFuncState *)in_stack_fffffffffffffe30,SVar7,
                               (SQInteger)in_stack_fffffffffffffe20,
                               (SQInteger)in_stack_fffffffffffffe18,
                               (SQInteger)in_stack_fffffffffffffe10,
                               (SQInteger)in_stack_fffffffffffffe08);
                  }
                  (in_RDI->_es).etype = 1;
                  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffe00);
                }
                else {
                  SQFuncState::PushTarget
                            ((SQFuncState *)in_stack_fffffffffffffe08,
                             (SQInteger)in_stack_fffffffffffffe00);
                  SVar7 = (SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20);
                  SQFuncState::PushTarget
                            ((SQFuncState *)in_stack_fffffffffffffe08,
                             (SQInteger)in_stack_fffffffffffffe00);
                  SQFuncState::GetConstant(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                  SQFuncState::AddInstruction
                            ((SQFuncState *)in_stack_fffffffffffffe30,SVar7,
                             (SQInteger)in_stack_fffffffffffffe20,
                             (SQInteger)in_stack_fffffffffffffe18,
                             (SQInteger)in_stack_fffffffffffffe10,
                             (SQInteger)in_stack_fffffffffffffe08);
                  bVar2 = NeedGet(in_stack_fffffffffffffe08);
                  if (bVar2) {
                    Emit2ArgsOP(in_stack_fffffffffffffe30,SVar7,(SQInteger)in_stack_fffffffffffffe20
                               );
                  }
                  (in_RDI->_es).etype = 2;
                }
              }
              else {
                bVar2 = NeedGet(in_stack_fffffffffffffe08);
                SVar7 = (SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20);
                if (bVar2) {
                  SVar3 = SQFuncState::PushTarget
                                    ((SQFuncState *)in_stack_fffffffffffffe08,
                                     (SQInteger)in_stack_fffffffffffffe00);
                  (in_RDI->_es).epos = SVar3;
                  SQFuncState::AddInstruction
                            ((SQFuncState *)in_stack_fffffffffffffe30,SVar7,
                             (SQInteger)in_stack_fffffffffffffe20,
                             (SQInteger)in_stack_fffffffffffffe18,
                             (SQInteger)in_stack_fffffffffffffe10,
                             (SQInteger)in_stack_fffffffffffffe08);
                }
                else {
                  (in_RDI->_es).etype = 5;
                  (in_RDI->_es).epos = local_78;
                }
              }
            }
            else {
              SQFuncState::PushTarget
                        ((SQFuncState *)in_stack_fffffffffffffe08,
                         (SQInteger)in_stack_fffffffffffffe00);
              (in_RDI->_es).etype = 4;
              (in_RDI->_es).epos = local_78;
            }
            return (in_RDI->_es).epos;
          }
          if (lVar1 - 0x12fU < 2) {
            PrefixIncDec(in_stack_fffffffffffffe30,(SQInteger)in_stack_fffffffffffffe28);
          }
          else if (lVar1 == 0x133) {
            Lex(in_stack_fffffffffffffe00);
            ClassExp(in_stack_fffffffffffffe30);
          }
          else {
            if (lVar1 == 0x136) goto LAB_00124cea;
            if (lVar1 == 0x139) {
              EmitLoadConstInt(in_stack_fffffffffffffe20,(SQInteger)in_stack_fffffffffffffe18,
                               (SQInteger)in_stack_fffffffffffffe10);
              Lex(in_stack_fffffffffffffe00);
            }
            else if (lVar1 == 0x13a) {
              pSVar5 = (SQCompiler *)in_RDI->_fs;
              SVar3 = SQFuncState::PushTarget
                                ((SQFuncState *)in_stack_fffffffffffffe08,(SQInteger)pSVar5);
              SVar7 = (SQOpcode)((ulong)in_stack_fffffffffffffe28 >> 0x20);
              SQFuncState::GetConstant(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
              SQFuncState::AddInstruction
                        ((SQFuncState *)in_stack_fffffffffffffe30,SVar7,
                         (SQInteger)in_stack_fffffffffffffe20,(SQInteger)in_stack_fffffffffffffe18,
                         (SQInteger)in_stack_fffffffffffffe10,SVar3);
              Lex(pSVar5);
            }
            else if (lVar1 - 0x13bU < 2) {
              SVar7 = (SQOpcode)((ulong)in_RDI->_fs >> 0x20);
              SQFuncState::PushTarget
                        ((SQFuncState *)in_stack_fffffffffffffe08,
                         (SQInteger)in_stack_fffffffffffffe00);
              SQFuncState::AddInstruction
                        ((SQFuncState *)in_stack_fffffffffffffe30,SVar7,
                         (SQInteger)in_stack_fffffffffffffe20,(SQInteger)in_stack_fffffffffffffe18,
                         (SQInteger)in_stack_fffffffffffffe10,(SQInteger)in_stack_fffffffffffffe08);
              Lex(in_stack_fffffffffffffe00);
            }
            else {
              Error(in_RDI,"expression expected");
            }
          }
        }
      }
    }
  }
  (in_RDI->_es).etype = 1;
  return -1;
}

Assistant:

SQInteger Factor()
    {
        //_es.etype = EXPR;
        switch(_token)
        {
        case TK_STRING_LITERAL:
            _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(_fs->CreateString(_lex._svalue,_lex._longstr.size()-1)));
            Lex();
            break;
        case TK_BASE:
            Lex();
            _fs->AddInstruction(_OP_GETBASE, _fs->PushTarget());
            _es.etype  = BASE;
            _es.epos   = _fs->TopTarget();
            return (_es.epos);
            break;
        case TK_IDENTIFIER:
        case TK_CONSTRUCTOR:
        case TK_THIS:{
                SQObject id;
                SQObject constant;

                switch(_token) {
                    case TK_IDENTIFIER:  id = _fs->CreateString(_lex._svalue);       break;
                    case TK_THIS:        id = _fs->CreateString(_SC("this"),4);        break;
                    case TK_CONSTRUCTOR: id = _fs->CreateString(_SC("constructor"),11); break;
                }

                SQInteger pos = -1;
                Lex();
                if((pos = _fs->GetLocalVariable(id)) != -1) {
                    /* Handle a local variable (includes 'this') */
                    _fs->PushTarget(pos);
                    _es.etype  = LOCAL;
                    _es.epos   = pos;
                }

                else if((pos = _fs->GetOuterVariable(id)) != -1) {
                    /* Handle a free var */
                    if(NeedGet()) {
                        _es.epos  = _fs->PushTarget();
                        _fs->AddInstruction(_OP_GETOUTER, _es.epos, pos);
                        /* _es.etype = EXPR; already default value */
                    }
                    else {
                        _es.etype = OUTER;
                        _es.epos  = pos;
                    }
                }

                else if(_fs->IsConstant(id, constant)) {
                    /* Handle named constant */
                    SQObjectPtr constval;
                    SQObject    constid;
                    if(type(constant) == OT_TABLE) {
                        Expect('.');
                        constid = Expect(TK_IDENTIFIER);
                        if(!_table(constant)->Get(constid, constval)) {
                            constval.Null();
                            Error(_SC("invalid constant [%s.%s]"), _stringval(id), _stringval(constid));
                        }
                    }
                    else {
                        constval = constant;
                    }
                    _es.epos = _fs->PushTarget();

                    /* generate direct or literal function depending on size */
                    SQObjectType ctype = type(constval);
                    switch(ctype) {
                        case OT_INTEGER: EmitLoadConstInt(_integer(constval),_es.epos); break;
                        case OT_FLOAT: EmitLoadConstFloat(_float(constval),_es.epos); break;
                        case OT_BOOL: _fs->AddInstruction(_OP_LOADBOOL, _es.epos, _integer(constval)); break;
                        default: _fs->AddInstruction(_OP_LOAD,_es.epos,_fs->GetConstant(constval)); break;
                    }
                    _es.etype = EXPR;
                }
                else {
                    /* Handle a non-local variable, aka a field. Push the 'this' pointer on
                    * the virtual stack (always found in offset 0, so no instruction needs to
                    * be generated), and push the key next. Generate an _OP_LOAD instruction
                    * for the latter. If we are not using the variable as a dref expr, generate
                    * the _OP_GET instruction.
                    */
                    _fs->PushTarget(0);
                    _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
                    if(NeedGet()) {
                        Emit2ArgsOP(_OP_GET);
                    }
                    _es.etype = OBJECT;
                }
                return _es.epos;
            }
            break;
        case TK_DOUBLE_COLON:  // "::"
            _fs->AddInstruction(_OP_LOADROOT, _fs->PushTarget());
            _es.etype = OBJECT;
            _token = _SC('.'); /* hack: drop into PrefixExpr, case '.'*/
            _es.epos = -1;
            return _es.epos;
            break;
        case TK_NULL:
            _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(),1);
            Lex();
            break;
        case TK_INTEGER: EmitLoadConstInt(_lex._nvalue,-1); Lex();  break;
        case TK_FLOAT: EmitLoadConstFloat(_lex._fvalue,-1); Lex(); break;
        case TK_TRUE: case TK_FALSE:
            _fs->AddInstruction(_OP_LOADBOOL, _fs->PushTarget(),_token == TK_TRUE?1:0);
            Lex();
            break;
        case _SC('['): {
                _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,0,NOT_ARRAY);
                SQInteger apos = _fs->GetCurrentPos(),key = 0;
                Lex();
                while(_token != _SC(']')) {
                    Expression();
                    if(_token == _SC(',')) Lex();
                    SQInteger val = _fs->PopTarget();
                    SQInteger array = _fs->TopTarget();
                    _fs->AddInstruction(_OP_APPENDARRAY, array, val, AAT_STACK);
                    key++;
                }
                _fs->SetIntructionParam(apos, 1, key);
                Lex();
            }
            break;
        case _SC('{'):
            _fs->AddInstruction(_OP_NEWOBJ, _fs->PushTarget(),0,NOT_TABLE);
            Lex();ParseTableOrClass(_SC(','),_SC('}'));
            break;
        case TK_FUNCTION: FunctionExp(_token);break;
        case _SC('@'): FunctionExp(_token,true);break;
        case TK_CLASS: Lex(); ClassExp();break;
        case _SC('-'):
            Lex();
            switch(_token) {
            case TK_INTEGER: EmitLoadConstInt(-_lex._nvalue,-1); Lex(); break;
            case TK_FLOAT: EmitLoadConstFloat(-_lex._fvalue,-1); Lex(); break;
            default: UnaryOP(_OP_NEG);
            }
            break;
        case _SC('!'): Lex(); UnaryOP(_OP_NOT); break;
        case _SC('~'):
            Lex();
            if(_token == TK_INTEGER)  { EmitLoadConstInt(~_lex._nvalue,-1); Lex(); break; }
            UnaryOP(_OP_BWNOT);
            break;
        case TK_TYPEOF : Lex() ;UnaryOP(_OP_TYPEOF); break;
        case TK_RESUME : Lex(); UnaryOP(_OP_RESUME); break;
        case TK_CLONE : Lex(); UnaryOP(_OP_CLONE); break;
        case TK_MINUSMINUS :
        case TK_PLUSPLUS :PrefixIncDec(_token); break;
        case TK_DELETE : DeleteExpr(); break;
        case _SC('('): Lex(); CommaExpr(); Expect(_SC(')'));
            break;
        case TK___LINE__: EmitLoadConstInt(_lex._currentline,-1); Lex(); break;
        case TK___FILE__: _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(_sourcename)); Lex(); break;
        default: Error(_SC("expression expected"));
        }
        _es.etype = EXPR;
        return -1;
    }